

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_pps.c
# Opt level: O1

MPP_RET process_prefix(H264_SLICE_t *currSlice)

{
  h264d_cur_ctx_t *phVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  RK_S32 _out;
  RK_S32 local_1c;
  
  MVar3 = MPP_OK;
  MVar2 = MPP_OK;
  if (currSlice->nal_reference_idc != 0) {
    phVar1 = currSlice->p_Cur;
    MVar2 = mpp_read_bits(&phVar1->bitctx,1,&local_1c);
    (phVar1->bitctx).ret = MVar2;
    if (((MVar2 == MPP_OK) &&
        ((((phVar1->prefix).store_ref_base_pic_flag = local_1c, MVar2 = MVar3,
          (currSlice->svcExt).use_ref_base_pic_flag != 0 ||
          ((phVar1->prefix).store_ref_base_pic_flag != 0)) && ((currSlice->svcExt).idr_flag == 0))))
       && (((byte)h264d_debug & 8) != 0)) {
      MVar2 = MPP_OK;
      _mpp_log_l(4,"h264d_pps","read dec_ref_base_pic_marking\n",(char *)0x0);
    }
  }
  return MVar2;
}

Assistant:

MPP_RET process_prefix(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    H264_PREFIX_t *cur_prefix = &p_Cur->prefix;

    if (currSlice->nal_reference_idc) {
        READ_ONEBIT(p_bitctx, &cur_prefix->store_ref_base_pic_flag);

        if ((currSlice->svcExt.use_ref_base_pic_flag ||
             cur_prefix->store_ref_base_pic_flag) &&
            !currSlice->svcExt.idr_flag) {
            H264D_LOG("read dec_ref_base_pic_marking\n");
        }
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    return p_bitctx->ret;
}